

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::load_gzip_external(CImg<unsigned_char> *this,char *filename)

{
  char cVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  FILE *pFVar9;
  char *pcVar10;
  CImg<char> *pCVar11;
  char *pcVar12;
  CImgIOException *pCVar13;
  uint uVar14;
  ulong uVar15;
  char cVar16;
  char *pcVar17;
  uint uVar18;
  bool bVar19;
  CImg<char> filename_tmp;
  CImg<char> command;
  CImg<char> body;
  CImg<char> local_70;
  CImg<char> local_50;
  
  if (filename == (char *)0x0) {
    pCVar13 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar17 = "non-";
    if (this->_is_shared != false) {
      pcVar17 = "";
    }
    CImgIOException::CImgIOException
              (pCVar13,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_gzip_external(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar17,"unsigned char");
    __cxa_throw(pCVar13,&CImgIOException::typeinfo,CImgException::~CImgException);
  }
  if ((*filename != '-') || ((pFVar9 = _stdin, filename[1] != '.' && (filename[1] != '\0')))) {
    pFVar9 = fopen(filename,"rb");
  }
  if (pFVar9 == (FILE *)0x0) {
    pCVar13 = (CImgIOException *)__cxa_allocate_exception(0x10);
    CImgIOException::CImgIOException
              (pCVar13,"cimg::fopen(): Failed to open file \'%s\' with mode \'%s\'.",filename,"rb");
    __cxa_throw(pCVar13,&CImgIOException::typeinfo,CImgException::~CImgException);
  }
  fclose(pFVar9);
  CImg<char>::CImg(&command,0x400,1,1,1);
  CImg<char>::CImg(&filename_tmp,0x100,1,1,1);
  CImg<char>::CImg(&body,0x100,1,1,1);
  pcVar17 = body._data;
  pcVar12 = filename;
  do {
    pcVar10 = pcVar12;
    pcVar5 = strchr(pcVar10,0x2e);
    pcVar12 = pcVar5 + 1;
  } while (filename <= pcVar5 + 1);
  if (pcVar10 == filename) {
    if (pcVar17 != (char *)0x0) {
      strcpy(pcVar17,filename);
    }
    sVar7 = strlen(filename);
    pcVar10 = filename + sVar7;
  }
  else if (pcVar17 != (char *)0x0) {
    uVar18 = ~(uint)filename + (int)pcVar10;
    if (uVar18 != 0) {
      memcpy(pcVar17,filename,(ulong)uVar18);
    }
    pcVar17[uVar18] = '\0';
  }
  pcVar17 = body._data;
  pcVar12 = body._data;
  if (body._data == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    do {
      pcVar5 = pcVar12;
      pcVar6 = strchr(pcVar5,0x2e);
      pcVar12 = pcVar6 + 1;
    } while (pcVar17 <= pcVar6 + 1);
    if (pcVar5 == pcVar17) {
      sVar7 = strlen(pcVar17);
      pcVar5 = pcVar17 + sVar7;
    }
  }
  do {
    sVar7 = strlen(pcVar10);
    pcVar17 = filename_tmp._data;
    uVar18 = filename_tmp._width;
    iVar3 = (int)sVar7;
    iVar4 = 2;
    if (iVar3 < 2) {
      iVar4 = iVar3;
    }
    uVar14 = iVar4 + 1;
    if (uVar14 == 0) {
LAB_0011dd7b:
      if (*pcVar5 == '\0') {
        pcVar12 = cimg::temporary_path((char *)0x0,false);
        pcVar6 = cimg::filenamerand();
        goto LAB_0011deb5;
      }
      pcVar6 = cimg::temporary_path((char *)0x0,false);
      pcVar8 = cimg::filenamerand();
      pcVar12 = pcVar5;
LAB_0011de94:
      snprintf(pcVar17,(ulong)uVar18,"%s%c%s.%s",pcVar6,0x2f,pcVar8,pcVar12);
    }
    else {
      if (iVar3 < 0) {
        bVar19 = true;
        uVar15 = 0;
      }
      else {
        if (1 < iVar3) {
          iVar3 = 2;
        }
        uVar15 = 0;
        do {
          cVar1 = pcVar10[uVar15];
          cVar2 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar2 = cVar1;
          }
          cVar1 = "%s.gz"[uVar15 + 3];
          cVar16 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar16 = cVar1;
          }
          bVar19 = cVar2 == cVar16;
          if (!bVar19) goto LAB_0011de41;
          uVar15 = uVar15 + 1;
        } while (iVar3 + 1 != (int)uVar15);
        uVar15 = (ulong)uVar14;
      }
LAB_0011de41:
      if (((uint)uVar15 == uVar14) || (bVar19)) goto LAB_0011dd7b;
      if (*pcVar10 != '\0') {
        pcVar6 = cimg::temporary_path((char *)0x0,false);
        pcVar8 = cimg::filenamerand();
        pcVar12 = pcVar10;
        goto LAB_0011de94;
      }
      pcVar12 = cimg::temporary_path((char *)0x0,false);
      pcVar6 = cimg::filenamerand();
LAB_0011deb5:
      snprintf(pcVar17,(ulong)uVar18,"%s%c%s",pcVar12,0x2f,pcVar6);
    }
    pFVar9 = fopen(filename_tmp._data,"rb");
    pcVar17 = command._data;
    if (pFVar9 == (FILE *)0x0) {
      pcVar10 = cimg::gunzip_path((char *)0x0,false);
      sVar7 = strlen(filename);
      CImg<char>::CImg(&local_50,filename,(int)sVar7 + 1,1,1,1,false);
      pCVar11 = CImg<char>::_system_strescape(&local_50);
      pcVar12 = pCVar11->_data;
      CImg<char>::string(&local_70,filename_tmp._data,true,false);
      pCVar11 = CImg<char>::_system_strescape(&local_70);
      snprintf(pcVar17,(ulong)command._width,"%s -c \"%s\" > \"%s\"",pcVar10,pcVar12,pCVar11->_data)
      ;
      if ((local_70._is_shared == false) && (local_70._data != (char *)0x0)) {
        operator_delete__(local_70._data);
      }
      if ((local_50._is_shared == false) && (local_50._data != (char *)0x0)) {
        operator_delete__(local_50._data);
      }
      pcVar17 = command._data;
      sVar7 = strlen(command._data);
      uVar15 = sVar7 & 0xffffffff;
      if (uVar15 != 0) {
        pcVar12 = (char *)operator_new__((ulong)((int)sVar7 + 0x10));
        strncpy(pcVar12,pcVar17,uVar15);
        builtin_strncpy(pcVar12 + uVar15," 2> /dev/null",0xe);
        system(pcVar12);
        operator_delete__(pcVar12);
      }
      pFVar9 = fopen(filename_tmp._data,"rb");
      if (pFVar9 == (FILE *)0x0) {
        pFVar9 = cimg::fopen(filename,"r");
        cimg::fclose(pFVar9);
        pCVar13 = (CImgIOException *)__cxa_allocate_exception(0x10);
        pcVar17 = "non-";
        if (this->_is_shared != false) {
          pcVar17 = "";
        }
        CImgIOException::CImgIOException
                  (pCVar13,
                   "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_gzip_external(): Failed to load file \'%s\' with external command \'gunzip\'."
                   ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                   (ulong)this->_spectrum,this->_data,pcVar17,"unsigned char",filename);
        __cxa_throw(pCVar13,&CImgIOException::typeinfo,CImgException::~CImgException);
      }
      if (((_stdin != pFVar9) && (_stdout != pFVar9)) && (uVar18 = fclose(pFVar9), uVar18 != 0)) {
        cimg::warn("cimg::fclose(): Error code %d returned during file closing.",(ulong)uVar18);
      }
      load(this,filename_tmp._data);
      remove(filename_tmp._data);
      if ((body._is_shared == false) && (body._data != (char *)0x0)) {
        operator_delete__(body._data);
      }
      if ((filename_tmp._is_shared == false) && (filename_tmp._data != (char *)0x0)) {
        operator_delete__(filename_tmp._data);
      }
      if ((command._is_shared == false) && (command._data != (char *)0x0)) {
        operator_delete__(command._data);
      }
      return this;
    }
    if (((_stdin != pFVar9) && (_stdout != pFVar9)) && (iVar4 = fclose(pFVar9), iVar4 != 0)) {
      cimg::warn("cimg::fclose(): Error code %d returned during file closing.");
    }
  } while( true );
}

Assistant:

CImg<T>& load_gzip_external(const char *const filename) {
      if (!filename)
        throw CImgIOException(_cimg_instance
                              "load_gzip_external(): Specified filename is (null).",
                              cimg_instance);
      std::fclose(cimg::fopen(filename,"rb"));            // Check if file exists.
      CImg<charT> command(1024), filename_tmp(256), body(256);
      const char
        *const ext = cimg::split_filename(filename,body),
        *const ext2 = cimg::split_filename(body,0);

      std::FILE *file = 0;
      do {
        if (!cimg::strcasecmp(ext,"gz")) {
          if (*ext2) cimg_snprintf(filename_tmp,filename_tmp._width,"%s%c%s.%s",
                                   cimg::temporary_path(),cimg_file_separator,cimg::filenamerand(),ext2);
          else cimg_snprintf(filename_tmp,filename_tmp._width,"%s%c%s",
                             cimg::temporary_path(),cimg_file_separator,cimg::filenamerand());
        } else {
          if (*ext) cimg_snprintf(filename_tmp,filename_tmp._width,"%s%c%s.%s",
                                  cimg::temporary_path(),cimg_file_separator,cimg::filenamerand(),ext);
          else cimg_snprintf(filename_tmp,filename_tmp._width,"%s%c%s",
                             cimg::temporary_path(),cimg_file_separator,cimg::filenamerand());
        }
        if ((file=std::fopen(filename_tmp,"rb"))!=0) cimg::fclose(file);
      } while (file);
      cimg_snprintf(command,command._width,"%s -c \"%s\" > \"%s\"",
                    cimg::gunzip_path(),
                    CImg<charT>::string(filename)._system_strescape().data(),
                    CImg<charT>::string(filename_tmp)._system_strescape().data());
      cimg::system(command);
      if (!(file = std::fopen(filename_tmp,"rb"))) {
        cimg::fclose(cimg::fopen(filename,"r"));
        throw CImgIOException(_cimg_instance
                              "load_gzip_external(): Failed to load file '%s' with external command 'gunzip'.",
                              cimg_instance,
                              filename);

      } else cimg::fclose(file);
      load(filename_tmp);
      std::remove(filename_tmp);
      return *this;
    }